

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O1

Id __thiscall QAccessibleCache::acquireId(QAccessibleCache *this)

{
  Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *this_00;
  Node<unsigned_int,_QAccessibleInterface_*> *pNVar1;
  Id IVar2;
  
  this_00 = *(Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> **)(this + 0x10);
  while ((this_00 != (Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> *)0x0 &&
         (pNVar1 = QHashPrivate::Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_>::
                   findNode<unsigned_int>(this_00,&acquireId::nextId),
         pNVar1 != (Node<unsigned_int,_QAccessibleInterface_*> *)0x0))) {
    IVar2 = acquireId::nextId + 1;
    if (acquireId::nextId == 0xfffffffe) {
      IVar2 = 0x80000000;
    }
    this_00 = *(Data<QHashPrivate::Node<unsigned_int,_QAccessibleInterface_*>_> **)(this + 0x10);
    acquireId::nextId = IVar2;
  }
  IVar2 = acquireId::nextId;
  acquireId::nextId = acquireId::nextId + 1;
  return IVar2;
}

Assistant:

QAccessible::Id QAccessibleCache::acquireId() const
{
    static const QAccessible::Id FirstId = QAccessible::Id(INT_MAX) + 1;
    static QAccessible::Id nextId = FirstId;

    while (idToInterface.contains(nextId)) {
        // (wrap back when when we reach UINT_MAX - 1)
        // -1 because on Android -1 is taken for the "View" so just avoid it completely for consistency
        if (nextId == UINT_MAX - 1)
            nextId = FirstId;
        else
            ++nextId;
    }

    return nextId++;
}